

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

DOMElement * __thiscall
xercesc_4_0::DOMDocumentImpl::createElementNS
          (DOMDocumentImpl *this,XMLCh *fNamespaceURI,XMLCh *qualifiedName,XMLFileLoc lineNo,
          XMLFileLoc columnNo)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMException *this_00;
  
  if (qualifiedName != (XMLCh *)0x0) {
    bVar1 = isXMLName(this,qualifiedName);
    if (bVar1) {
      iVar2 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0xc0);
      XSDElementNSImpl::XSDElementNSImpl
                ((XSDElementNSImpl *)CONCAT44(extraout_var,iVar2),&this->super_DOMDocument,
                 fNamespaceURI,qualifiedName,lineNo,columnNo);
      return (DOMElement *)(XSDElementNSImpl *)CONCAT44(extraout_var,iVar2);
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,5,0,this->fMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMElement *DOMDocumentImpl::createElementNS(const XMLCh *fNamespaceURI,
                                              const XMLCh *qualifiedName,
                                              const XMLFileLoc lineNo,
                                              const XMLFileLoc columnNo)
{
    if(!qualifiedName || !isXMLName(qualifiedName))
        throw DOMException(DOMException::INVALID_CHARACTER_ERR,0, getMemoryManager());

    return new (this) XSDElementNSImpl(this, fNamespaceURI, qualifiedName, lineNo, columnNo);
}